

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_branch_n(DisasContext_conflict8 *dc,target_ulong pc1)

{
  target_ulong tVar1;
  
  tVar1 = dc->npc;
  if (tVar1 != 1) {
    dc->pc = tVar1;
    dc->jump_pc[0] = pc1;
    dc->jump_pc[1] = tVar1 + 4;
    dc->npc = 2;
    return;
  }
  gen_branch_n_cold_1();
  return;
}

Assistant:

static void gen_branch_n(DisasContext *dc, target_ulong pc1)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    target_ulong npc = dc->npc;

    if (likely(npc != DYNAMIC_PC)) {
        dc->pc = npc;
        dc->jump_pc[0] = pc1;
        dc->jump_pc[1] = npc + 4;
        dc->npc = JUMP_PC;
    } else {
        TCGv t, z;

        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->cpu_npc);

        tcg_gen_addi_tl(tcg_ctx, tcg_ctx->cpu_npc, tcg_ctx->cpu_npc, 4);
        t = tcg_const_tl(tcg_ctx, pc1);
        z = tcg_const_tl(tcg_ctx, 0);
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_npc, tcg_ctx->cpu_cond, z, t, tcg_ctx->cpu_npc);
        tcg_temp_free(tcg_ctx, t);
        tcg_temp_free(tcg_ctx, z);

        dc->pc = DYNAMIC_PC;
    }
}